

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

char * nullcGetResult(void)

{
  char *local_10;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    local_10 = "";
  }
  else if (NULLC::currExec == 1) {
    local_10 = ExecutorX86::GetResult(NULLC::executorX86);
  }
  else if (NULLC::currExec == 0) {
    local_10 = ExecutorRegVm::GetResult(NULLC::executorRegVm);
  }
  else {
    local_10 = "unknown executor";
  }
  return local_10;
}

Assistant:

const char* nullcGetResult()
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED("");

#ifdef NULLC_BUILD_X86_JIT
	if(currExec == NULLC_X86)
		return executorX86->GetResult();
#endif
#if defined(NULLC_LLVM_SUPPORT) && !defined(NULLC_NO_EXECUTOR)
	if(currExec == NULLC_LLVM)
		return executorLLVM->GetResult();
#endif
#ifndef NULLC_NO_EXECUTOR
	if(currExec == NULLC_REG_VM)
		return executorRegVm->GetResult();
#endif

	return "unknown executor";
}